

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DynamicType.cpp
# Opt level: O0

bool __thiscall Js::DynamicType::SetHasNoEnumerableProperties(DynamicType *this,bool value)

{
  code *pcVar1;
  bool bVar2;
  int iVar3;
  DynamicTypeHandler *pDVar4;
  ScriptContext *pSVar5;
  undefined4 *puVar6;
  undefined1 local_70 [8];
  PropertyValueInfo info;
  undefined8 uStack_28;
  PropertyId propertyId;
  JavascriptString *propertyString;
  PropertyIndex propertyIndex;
  DynamicType *pDStack_18;
  bool value_local;
  DynamicType *this_local;
  
  if (value) {
    propertyString._4_2_ = 0xffff;
    uStack_28 = 0;
    info.isFunctionPIC = true;
    info.allowResizingPolymorphicInlineCache = true;
    info._62_2_ = 0xffff;
    propertyString._7_1_ = value;
    pDStack_18 = this;
    PropertyValueInfo::PropertyValueInfo((PropertyValueInfo *)local_70);
    pDVar4 = GetTypeHandler(this);
    pSVar5 = Js::Type::GetScriptContext(&this->super_Type);
    iVar3 = (*pDVar4->_vptr_DynamicTypeHandler[10])
                      (pDVar4,pSVar5,(long)&propertyString + 4,&stack0xffffffffffffffd8,
                       &info.isFunctionPIC,0,this,this,0,0,local_70);
    if (iVar3 != 0) {
      AssertCount = AssertCount + 1;
      Throw::LogAssert();
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 1;
      bVar2 = Throw::ReportAssert("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Runtime/Types/DynamicType.cpp"
                                  ,0xb6,
                                  "(!this->GetTypeHandler()->FindNextProperty(this->GetScriptContext(), propertyIndex, &propertyString, &propertyId, nullptr, this, this, EnumeratorFlags::None, nullptr, &info))"
                                  ,
                                  "!this->GetTypeHandler()->FindNextProperty(this->GetScriptContext(), propertyIndex, &propertyString, &propertyId, nullptr, this, this, EnumeratorFlags::None, nullptr, &info)"
                                 );
      if (!bVar2) {
        pcVar1 = (code *)invalidInstructionException();
        (*pcVar1)();
      }
      puVar6 = (undefined4 *)__tls_get_addr(&PTR_01e57ed8);
      *puVar6 = 0;
    }
    this->hasNoEnumerableProperties = true;
    this_local._7_1_ = true;
  }
  else {
    this->hasNoEnumerableProperties = value;
    this_local._7_1_ = false;
  }
  return this_local._7_1_;
}

Assistant:

bool
    DynamicType::SetHasNoEnumerableProperties(bool value)
    {
        if (!value)
        {
            this->hasNoEnumerableProperties = value;
            return false;
        }

#if DEBUG
        PropertyIndex propertyIndex = (PropertyIndex)-1;
        JavascriptString* propertyString = nullptr;
        PropertyId propertyId = Constants::NoProperty;
        PropertyValueInfo info;
        Assert(!this->GetTypeHandler()->FindNextProperty(this->GetScriptContext(), propertyIndex, &propertyString, &propertyId, nullptr, this, this, EnumeratorFlags::None, nullptr, &info));
#endif

        this->hasNoEnumerableProperties = true;
        return true;
    }